

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode ExpandedNodeId_encodeBinary(UA_ExpandedNodeId *src,UA_DataType *_)

{
  UA_Byte encoding;
  UA_Byte UVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  uint uVar4;
  
  UVar1 = ((UA_Byte *)0x1 < (src->namespaceUri).data) * -0x80;
  encoding = UVar1 + '@';
  if (src->serverIndex == 0) {
    encoding = UVar1;
  }
  UVar2 = NodeId_encodeBinaryWithEncodingMask(&src->nodeId,encoding);
  if ((UA_Byte *)0x1 < (src->namespaceUri).data) {
    UVar3 = Array_encodeBinary((src->namespaceUri).data,(src->namespaceUri).length,UA_TYPES + 2);
    UVar2 = UVar2 | UVar3;
  }
  if (src->serverIndex != 0) {
    uVar4 = 0x80080000;
    if (pos + 4 <= end) {
      *(UA_UInt32 *)pos = src->serverIndex;
      pos = pos + 4;
      uVar4 = 0;
    }
    UVar2 = UVar2 | uVar4;
  }
  return UVar2;
}

Assistant:

static UA_StatusCode
ExpandedNodeId_encodeBinary(UA_ExpandedNodeId const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encoding = 0;
    if((void*)src->namespaceUri.data > UA_EMPTY_ARRAY_SENTINEL)
        encoding |= UA_EXPANDEDNODEID_NAMESPACEURI_FLAG;
    if(src->serverIndex > 0)
        encoding |= UA_EXPANDEDNODEID_SERVERINDEX_FLAG;

    /* Encode the content */
    UA_StatusCode retval = NodeId_encodeBinaryWithEncodingMask(&src->nodeId, encoding);
    if((void*)src->namespaceUri.data > UA_EMPTY_ARRAY_SENTINEL)
        retval |= String_encodeBinary(&src->namespaceUri, NULL);
    if(src->serverIndex > 0)
        retval |= UInt32_encodeBinary(&src->serverIndex, NULL);
    return retval;
}